

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O1

char fsnav_remove_plugin(_func_void *plugin)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  fsnav_plugin *pfVar4;
  fsnav_struct *pfVar5;
  fsnav_plugin *pfVar6;
  long lVar7;
  fsnav_core *pfVar8;
  char cVar9;
  ulong uVar10;
  size_t *psVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  
  pfVar8 = &fsnav->core;
  if ((fsnav->core).plugin_count == 0) {
    cVar9 = '\0';
    uVar13 = 0;
  }
  else {
    lVar7 = 0;
    cVar9 = '\0';
    uVar10 = 0;
    do {
      psVar11 = &(fsnav->core).plugin_count;
      if (pfVar8->plugins[uVar10].func == plugin) {
        lVar12 = lVar7;
        uVar13 = uVar10;
        uVar14 = uVar10;
        if (uVar10 + 1 < *psVar11) {
          do {
            pfVar6 = pfVar8->plugins;
            *(undefined8 *)((long)&pfVar6->tick + lVar12) =
                 *(undefined8 *)((long)&pfVar6[1].tick + lVar12);
            puVar2 = (undefined8 *)((long)&pfVar6[1].func + lVar12);
            uVar3 = puVar2[1];
            puVar1 = (undefined8 *)((long)&pfVar6->func + lVar12);
            *puVar1 = *puVar2;
            puVar1[1] = uVar3;
            uVar13 = uVar14 + 1;
            uVar15 = uVar14 + 2;
            lVar12 = lVar12 + 0x18;
            uVar14 = uVar13;
          } while (uVar15 < *psVar11);
        }
        pfVar8->plugins[uVar13].func = (_func_void *)0x0;
        pfVar5 = fsnav;
        pfVar6 = (fsnav->core).plugins;
        pfVar4 = pfVar6 + uVar13;
        pfVar4->cycle = 0;
        pfVar4->shift = 0;
        pfVar6[uVar13].tick = 0;
        psVar11 = &(pfVar5->core).plugin_count;
        *psVar11 = *psVar11 - 1;
        cVar9 = cVar9 + '\x01';
      }
      uVar10 = uVar10 + 1;
      pfVar8 = &fsnav->core;
      uVar13 = (fsnav->core).plugin_count;
      lVar7 = lVar7 + 0x18;
    } while (uVar10 < uVar13);
  }
  pfVar6 = (fsnav_plugin *)realloc(pfVar8->plugins,uVar13 * 0x18);
  if ((pfVar6 == (fsnav_plugin *)0x0) && ((fsnav->core).plugin_count != 0)) {
    fsnav_free();
    cVar9 = '\0';
  }
  else {
    (fsnav->core).plugins = pfVar6;
  }
  return cVar9;
}

Assistant:

char fsnav_remove_plugin(void(*plugin)(void))
{
	size_t       i, j;
	char         flag = 0;
	fsnav_plugin* reallocated_pointer;

	for (i = 0; i < fsnav->core.plugin_count; i++) { // go through the execution list
		if (fsnav->core.plugins[i].func != plugin)   // if not the requested plugin, do nothing
			continue;
		// otherwise, remove the current plugin from the execution list
		for (j = i+1; j < fsnav->core.plugin_count; j++) // copy all succeeding plugins one position lower
			fsnav->core.plugins[j-1] = fsnav->core.plugins[j];
		// reset the last one
		j--;
		fsnav->core.plugins[j].func  = NULL;
		fsnav->core.plugins[j].cycle = 0;
		fsnav->core.plugins[j].shift = 0;
		fsnav->core.plugins[j].tick  = 0;
		fsnav->core.plugin_count--;
		if (flag < 0xff)
			flag++;
	}

	// reallocate memory
	reallocated_pointer = (fsnav_plugin*)realloc((void*)(fsnav->core.plugins), fsnav->core.plugin_count*sizeof(fsnav_plugin));
	if (fsnav->core.plugin_count > 0 && reallocated_pointer == NULL) { // memory reallocation somehow failed
		fsnav_free();
		return 0;
	}
	fsnav->core.plugins = reallocated_pointer;

	return flag;
}